

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclShortNames(SC_Lib *p)

{
  Vec_Ptr_t *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  SC_Cell *pClass;
  char *pcVar4;
  void *pvVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int i_1;
  int iVar9;
  int iVar10;
  int iVar11;
  uint i_00;
  int iVar12;
  char cVar13;
  int i;
  int iVar14;
  SC_Cell *pCell;
  char Buffer [10000];
  char local_2748 [10008];
  
  uVar1 = Abc_SclLibClassNum(p);
  uVar1 = Abc_Base10Log(uVar1);
  for (i_00 = 0; (int)i_00 < (p->vCellClasses).nSize; i_00 = i_00 + 1) {
    pClass = (SC_Cell *)Vec_PtrEntry(&p->vCellClasses,i_00);
    uVar2 = Abc_SclClassCellNum(pClass);
    uVar2 = Abc_Base10Log(uVar2);
    iVar12 = 0;
    for (pCell = pClass; pCell != pClass || iVar12 == 0; pCell = pCell->pNext) {
      if (pCell->pName != (char *)0x0) {
        free(pCell->pName);
        pCell->pName = (char *)0x0;
      }
      sprintf(local_2748,"g%0*d_%0*d",(ulong)uVar1,(ulong)i_00,(ulong)uVar2);
      pcVar4 = Abc_UtilStrsav(local_2748);
      pCell->pName = pcVar4;
      p_00 = &pCell->vPins;
      for (iVar11 = pCell->n_inputs; iVar11 < (pCell->vPins).nSize; iVar11 = iVar11 + 1) {
        pvVar5 = Vec_PtrEntry(p_00,iVar11);
        for (iVar10 = 0; iVar10 < *(int *)((long)pvVar5 + 0x44); iVar10 = iVar10 + 1) {
          puVar6 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)((long)pvVar5 + 0x40),iVar10);
          for (iVar14 = 0; iVar14 < *(int *)((long)puVar6 + 0xc); iVar14 = iVar14 + 1) {
            puVar7 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)(puVar6 + 1),iVar14);
            for (iVar9 = 0; iVar9 < pCell->n_inputs; iVar9 = iVar9 + 1) {
              puVar8 = (undefined8 *)Vec_PtrEntry(p_00,iVar9);
              pcVar4 = (char *)*puVar7;
              if (pcVar4 != (char *)0x0) {
                iVar3 = strcmp(pcVar4,(char *)*puVar8);
                if (iVar3 == 0) {
                  free(pcVar4);
                  *puVar7 = 0;
                  local_2748[0] = (char)iVar9 + 'a';
                  local_2748[1] = 0;
                  pcVar4 = Abc_UtilStrsav(local_2748);
                  *puVar7 = pcVar4;
                }
              }
            }
          }
          for (iVar14 = 0; iVar14 < pCell->n_inputs; iVar14 = iVar14 + 1) {
            puVar7 = (undefined8 *)Vec_PtrEntry(p_00,iVar14);
            pcVar4 = (char *)*puVar6;
            if (pcVar4 != (char *)0x0) {
              iVar9 = strcmp(pcVar4,(char *)*puVar7);
              if (iVar9 == 0) {
                free(pcVar4);
                *puVar6 = 0;
                local_2748[0] = (char)iVar14 + 'a';
                local_2748[1] = 0;
                pcVar4 = Abc_UtilStrsav(local_2748);
                *puVar6 = pcVar4;
              }
            }
          }
        }
        Abc_SclShortFormula(pCell,*(char **)((long)pvVar5 + 0x28),local_2748);
        if (*(void **)((long)pvVar5 + 0x28) != (void *)0x0) {
          free(*(void **)((long)pvVar5 + 0x28));
          *(undefined8 *)((long)pvVar5 + 0x28) = 0;
        }
        pcVar4 = Abc_UtilStrsav(local_2748);
        *(char **)((long)pvVar5 + 0x28) = pcVar4;
      }
      iVar11 = 0;
      while( true ) {
        iVar10 = pCell->n_inputs;
        if (iVar10 <= iVar11) break;
        puVar6 = (undefined8 *)Vec_PtrEntry(p_00,iVar11);
        if ((void *)*puVar6 != (void *)0x0) {
          free((void *)*puVar6);
          *puVar6 = 0;
        }
        local_2748[0] = (char)iVar11 + 'a';
        local_2748[1] = 0;
        pcVar4 = Abc_UtilStrsav(local_2748);
        *puVar6 = pcVar4;
        iVar11 = iVar11 + 1;
      }
      cVar13 = 'z' - (char)iVar10;
      for (; iVar10 < (pCell->vPins).nSize; iVar10 = iVar10 + 1) {
        puVar6 = (undefined8 *)Vec_PtrEntry(p_00,iVar10);
        if ((void *)*puVar6 != (void *)0x0) {
          free((void *)*puVar6);
          *puVar6 = 0;
        }
        local_2748[0] = (char)pCell->n_inputs + cVar13;
        local_2748[1] = 0;
        pcVar4 = Abc_UtilStrsav(local_2748);
        *puVar6 = pcVar4;
        cVar13 = cVar13 + -1;
      }
      iVar12 = iVar12 + 1;
    }
  }
  p->nBins = 0;
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  Abc_SclHashCells(p);
  printf("Renaming library \"%s\" into \"%s%d\".\n",p->pName,"lib",(ulong)(uint)(p->vCells).nSize);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  sprintf(local_2748,"lib%d",(ulong)(uint)(p->vCells).nSize);
  pcVar4 = Abc_UtilStrsav(local_2748);
  p->pName = pcVar4;
  return;
}

Assistant:

void Abc_SclShortNames( SC_Lib * p )
{
    char Buffer[10000];
    SC_Cell * pClass, * pCell; SC_Pin * pPin;
    int i, k, n, nClasses = Abc_SclLibClassNum(p);
    int nDigits = Abc_Base10Log( nClasses );
    // itereate through classes
    SC_LibForEachCellClass( p, pClass, i )
    {
        int nDigits2 = Abc_Base10Log( Abc_SclClassCellNum(pClass) );
        SC_RingForEachCell( pClass, pCell, k )
        {
            ABC_FREE( pCell->pName );
            sprintf( Buffer, "g%0*d_%0*d", nDigits, i, nDigits2, k );
            pCell->pName = Abc_UtilStrsav( Buffer );
            // formula
            SC_CellForEachPinOut( pCell, pPin, n )
                Abc_SclPinUpdate( pCell, pPin, Buffer );
            // pin names
            SC_CellForEachPinIn( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'a'+n );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
            SC_CellForEachPinOut( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'z'-n+pCell->n_inputs );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
        }
    }
    p->nBins = 0;
    ABC_FREE( p->pBins );
    Abc_SclHashCells( p );
    // update library name
    printf( "Renaming library \"%s\" into \"%s%d\".\n", p->pName, "lib", SC_LibCellNum(p) );
    ABC_FREE( p->pName );
    sprintf( Buffer, "lib%d", SC_LibCellNum(p) );
    p->pName = Abc_UtilStrsav( Buffer );
}